

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

bool has_phong_mat(aiScene *scene)

{
  ai_real local_2c;
  aiMaterial *paStack_28;
  float shininess;
  aiMaterial *mat;
  size_t i;
  aiScene *scene_local;
  
  mat = (aiMaterial *)0x0;
  i = (size_t)scene;
  while( true ) {
    if ((aiMaterial *)(ulong)*(uint *)(i + 0x20) <= mat) {
      return false;
    }
    paStack_28 = *(aiMaterial **)(*(long *)(i + 0x28) + (long)mat * 8);
    local_2c = 0.0;
    aiMaterial::Get(paStack_28,"$mat.shininess",0,0,&local_2c);
    if (0.0 < local_2c) break;
    mat = (aiMaterial *)((long)&mat->mProperties + 1);
  }
  return true;
}

Assistant:

bool has_phong_mat(const aiScene* scene)
{
    // just search for any material with a shininess exponent
    for (size_t i = 0; i < scene->mNumMaterials; ++i) {
        aiMaterial* mat = scene->mMaterials[i];
        float shininess = 0;
        mat->Get(AI_MATKEY_SHININESS, shininess);
        if (shininess > 0) {
            return true;
        }
    }
    return false;
}